

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O2

void __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::setReferenceNonConstant
          (Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *this,
          Matrix<double,__1,__1,_0,__1,__1> *t,Mutex *mutexref)

{
  this->signalType = REFERENCE_NON_CONST;
  this->Treference = t;
  this->TreferenceNonConst = t;
  this->providerMutex = mutexref;
  this->copyInit = false;
  (this->super_SignalBase<int>).ready = true;
  return;
}

Assistant:

void Signal<T, Time>::setReferenceNonConstant(T *t, Mutex *mutexref) {
  signalType = REFERENCE_NON_CONST;
  Treference = t;
  TreferenceNonConst = t;
  providerMutex = mutexref;
  copyInit = false;
  setReady();
}